

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

void __thiscall Highs::deprecationMessage(Highs *this,string *method_name,string *alt_method_name)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  char *in_RDX;
  long in_RDI;
  
  iVar1 = std::__cxx11::string::compare(in_RDX);
  if (iVar1 == 0) {
    uVar2 = std::__cxx11::string::c_str();
    highsLogUser((HighsLogOptions *)(in_RDI + 0xe28),kWarning,
                 "Method %s is deprecated: no alternative method\n",uVar2);
  }
  else {
    uVar2 = std::__cxx11::string::c_str();
    uVar3 = std::__cxx11::string::c_str();
    highsLogUser((HighsLogOptions *)(in_RDI + 0xe28),kWarning,
                 "Method %s is deprecated: alternative method is %s\n",uVar2,uVar3);
  }
  return;
}

Assistant:

void Highs::deprecationMessage(const std::string& method_name,
                               const std::string& alt_method_name) const {
  if (alt_method_name.compare("None") == 0) {
    highsLogUser(options_.log_options, HighsLogType::kWarning,
                 "Method %s is deprecated: no alternative method\n",
                 method_name.c_str());
  } else {
    highsLogUser(options_.log_options, HighsLogType::kWarning,
                 "Method %s is deprecated: alternative method is %s\n",
                 method_name.c_str(), alt_method_name.c_str());
  }
}